

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary.cpp
# Opt level: O1

index_type *
booster::locale::boundary::impl_icu::map_direct
          (index_type *__return_storage_ptr__,boundary_type t,BreakIterator *it,int reserve)

{
  pointer *ppbVar1;
  uint uVar2;
  iterator iVar3;
  int iVar4;
  uint uVar5;
  runtime_error *this;
  char *pcVar6;
  rule_type *prVar7;
  ulong uVar8;
  uint uVar9;
  int *piVar10;
  UErrorCode err;
  vector<int,_std::allocator<int>_> buffer;
  int32_t membuf [8];
  int local_a0;
  allocator local_99;
  string local_98;
  vector<int,_std::allocator<int>_> local_78;
  int local_58 [10];
  
  (__return_storage_ptr__->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  ::reserve(__return_storage_ptr__,(long)reserve);
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_98._M_string_length._0_4_ = 0;
  iVar3._M_current =
       (__return_storage_ptr__->
       super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    ::_M_realloc_insert<booster::locale::boundary::break_info>
              (__return_storage_ptr__,iVar3,(break_info *)&local_98);
  }
  else {
    *(undefined4 *)&(iVar3._M_current)->offset = 0;
    *(undefined4 *)((long)&(iVar3._M_current)->offset + 4) = 0;
    (iVar3._M_current)->rule = 0;
    *(uint *)&(iVar3._M_current)->field_0xc = local_98._M_string_length._4_4_;
    ppbVar1 = &(__return_storage_ptr__->
               super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppbVar1 = *ppbVar1 + 1;
  }
  (**(code **)(*(long *)it + 0x50))(it);
  do {
    while( true ) {
      iVar4 = (**(code **)(*(long *)it + 0x68))(it);
      if (iVar4 == -1) {
        return __return_storage_ptr__;
      }
      local_98._M_dataplus._M_p = (pointer)(long)iVar4;
      local_98._M_string_length._0_4_ = 0;
      iVar3._M_current =
           (__return_storage_ptr__->
           super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
        ::_M_realloc_insert<booster::locale::boundary::break_info>
                  (__return_storage_ptr__,iVar3,(break_info *)&local_98);
      }
      else {
        (iVar3._M_current)->offset = (size_t)local_98._M_dataplus._M_p;
        *(ulong *)&(iVar3._M_current)->rule = (ulong)local_98._M_string_length._4_4_ << 0x20;
        ppbVar1 = &(__return_storage_ptr__->
                   super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      if (t != character) break;
      prVar7 = &(__return_storage_ptr__->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_finish[-1].rule;
      *prVar7 = *prVar7 | 0xf;
    }
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_58[4] = 0;
    local_58[5] = 0;
    local_58[6] = 0;
    local_58[7] = 0;
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    local_a0 = 0;
    uVar5 = (**(code **)(*(long *)it + 0xa0))(it,local_58,8,&local_a0);
    piVar10 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    if (local_a0 == 0xf) {
      local_98._M_dataplus._M_p = local_98._M_dataplus._M_p & 0xffffffff00000000;
      std::vector<int,_std::allocator<int>_>::resize
                (&local_78,(long)(int)uVar5,(value_type_conflict1 *)&local_98);
      uVar5 = (**(code **)(*(long *)it + 0xa0))
                        (it,piVar10,
                         (ulong)((long)local_78.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start) >> 2,&local_a0);
    }
    else {
      piVar10 = local_58;
    }
    iVar4 = local_a0;
    if (0 < local_a0) {
      this = (runtime_error *)__cxa_allocate_exception(0x30);
      pcVar6 = (char *)u_errorName_70(iVar4);
      std::__cxx11::string::string((string *)&local_98,pcVar6,&local_99);
      runtime_error::runtime_error(this,&local_98);
      __cxa_throw(this,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    if (0 < (int)uVar5) {
      prVar7 = &(__return_storage_ptr__->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_finish[-1].rule;
      uVar8 = 0;
      do {
        if (t == line) {
          uVar2 = piVar10[uVar8];
joined_r0x0017e397:
          uVar9 = 0xf;
          if ((uVar2 < 100) || (uVar9 = 0xf0, uVar2 - 100 < 100)) {
LAB_0017e3a6:
            *prVar7 = *prVar7 | uVar9;
          }
        }
        else {
          if (t == sentence) {
            uVar2 = piVar10[uVar8];
            goto joined_r0x0017e397;
          }
          if (t == word) {
            uVar2 = piVar10[uVar8];
            uVar9 = 0xf;
            if ((((99 < uVar2) && (uVar9 = 0xf0, 99 < uVar2 - 100)) &&
                (uVar9 = 0xf00, 99 < uVar2 - 200)) &&
               ((uVar9 = 0xf000, 99 < uVar2 - 300 && (uVar9 = 0xf0000, 99 < uVar2 - 400))))
            goto LAB_0017e3a8;
            goto LAB_0017e3a6;
          }
        }
LAB_0017e3a8:
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar8);
    }
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  } while( true );
}

Assistant:

index_type map_direct(boundary_type t,icu::BreakIterator *it,int reserve)
{
    index_type indx;
    indx.reserve(reserve);
#if U_ICU_VERSION_MAJOR_NUM >= 52
    icu::BreakIterator *rbbi=it;
#else
    icu::RuleBasedBreakIterator *rbbi=dynamic_cast<icu::RuleBasedBreakIterator *>(it);
#endif
    
    indx.push_back(break_info());
    it->first();
    int pos=0;
    while((pos=it->next())!=icu::BreakIterator::DONE) {
        indx.push_back(break_info(pos));
        /// Character does not have any specific break types
        if(t!=character && rbbi) {
            //
            // There is a collapse for MSVC: int32_t defined by both boost::cstdint and icu...
            // So need to pick one ;(
            //
            std::vector< ::int32_t> buffer;
            ::int32_t membuf[8]={0}; // try not to use memory allocation if possible
            ::int32_t *buf=membuf;

            UErrorCode err=U_ZERO_ERROR;
            int n = rbbi->getRuleStatusVec(buf,8,err);
            
            if(err == U_BUFFER_OVERFLOW_ERROR) {
                buf=&buffer.front();
                buffer.resize(n,0);
                n = rbbi->getRuleStatusVec(buf,buffer.size(),err);
            }

            check_and_throw_icu_error(err);

            for(int i=0;i<n;i++) {
                switch(t) {
                case word:
                    if(UBRK_WORD_NONE<=buf[i] && buf[i]<UBRK_WORD_NONE_LIMIT)
                        indx.back().rule |= word_none;
                    else if(UBRK_WORD_NUMBER<=buf[i] && buf[i]<UBRK_WORD_NUMBER_LIMIT)
                        indx.back().rule |= word_number;
                    else if(UBRK_WORD_LETTER<=buf[i] && buf[i]<UBRK_WORD_LETTER_LIMIT)
                        indx.back().rule |= word_letter;
                    else if(UBRK_WORD_KANA<=buf[i] && buf[i]<UBRK_WORD_KANA_LIMIT)
                        indx.back().rule |= word_kana;
                    else if(UBRK_WORD_IDEO<=buf[i] && buf[i]<UBRK_WORD_IDEO_LIMIT)
                        indx.back().rule |= word_ideo;
                    break;

                case line:
                    if(UBRK_LINE_SOFT<=buf[i] && buf[i]<UBRK_LINE_SOFT_LIMIT)
                        indx.back().rule |= line_soft;
                    else if(UBRK_LINE_HARD<=buf[i] && buf[i]<UBRK_LINE_HARD_LIMIT)
                        indx.back().rule |= line_hard;
                    break;

                case sentence:
                    if(UBRK_SENTENCE_TERM<=buf[i] && buf[i]<UBRK_SENTENCE_TERM_LIMIT)
                        indx.back().rule |= sentence_term;
                    else if(UBRK_SENTENCE_SEP<=buf[i] && buf[i]<UBRK_SENTENCE_SEP_LIMIT)
                        indx.back().rule |= sentence_sep;
                    break;
                default:
                    ;
                }
            }
        }
        else {
            indx.back().rule |=character_any; // Baisc mark... for character
        }
    }
    return indx;
}